

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O0

void __thiscall
InterpreterTestSuite_PC_JoinerEnable_Test::~InterpreterTestSuite_PC_JoinerEnable_Test
          (InterpreterTestSuite_PC_JoinerEnable_Test *this)

{
  InterpreterTestSuite_PC_JoinerEnable_Test *this_local;
  
  ~InterpreterTestSuite_PC_JoinerEnable_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_JoinerEnable)
{
    TestContext ctx;
    InitContext(ctx);

    EXPECT_CALL(*ctx.mDefaultCommissionerObject,
                EnableJoiner(JoinerType::kMeshCoP, 1, StrEq("psk"), StrEq("url://provision.ing")))
        .WillOnce(Return(Error{}));

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("joiner enable meshcop 1 psk url://provision.ing");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
}